

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O3

AggregateFunction *
duckdb::ApproxQuantileDecimalFunction(AggregateFunction *__return_storage_ptr__,LogicalType *type)

{
  InternalException *this;
  string local_40;
  
  switch(type->physical_type_) {
  case INT8:
    LogicalType::LogicalType((LogicalType *)&local_40,TINYINT);
    GetApproximateQuantileAggregateFunction(__return_storage_ptr__,(LogicalType *)&local_40);
    break;
  case UINT16:
  case UINT32:
  case UINT64:
switchD_018ba2bd_caseD_4:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Unimplemented quantile decimal aggregate","");
    InternalException::InternalException(this,&local_40);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case INT16:
    LogicalType::LogicalType((LogicalType *)&local_40,SMALLINT);
    GetApproximateQuantileAggregateFunction(__return_storage_ptr__,(LogicalType *)&local_40);
    break;
  case INT32:
    LogicalType::LogicalType((LogicalType *)&local_40,INTEGER);
    GetApproximateQuantileAggregateFunction(__return_storage_ptr__,(LogicalType *)&local_40);
    break;
  case INT64:
    LogicalType::LogicalType((LogicalType *)&local_40,BIGINT);
    GetApproximateQuantileAggregateFunction(__return_storage_ptr__,(LogicalType *)&local_40);
    break;
  default:
    if (type->physical_type_ != INT128) goto switchD_018ba2bd_caseD_4;
    LogicalType::LogicalType((LogicalType *)&local_40,HUGEINT);
    GetApproximateQuantileAggregateFunction(__return_storage_ptr__,(LogicalType *)&local_40);
  }
  LogicalType::~LogicalType((LogicalType *)&local_40);
  ::std::__cxx11::string::_M_replace
            ((ulong)&(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.
                     super_Function.name,0,
             (char *)(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.
                     super_Function.name._M_string_length,0x1de5a15);
  __return_storage_ptr__->serialize = ApproximateQuantileBindData::Serialize;
  __return_storage_ptr__->deserialize = ApproximateQuantileBindData::Deserialize;
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction ApproxQuantileDecimalFunction(const LogicalType &type) {
	auto function = GetApproximateQuantileDecimalAggregateFunction(type);
	function.name = "approx_quantile";
	function.serialize = ApproximateQuantileBindData::Serialize;
	function.deserialize = ApproximateQuantileBindData::Deserialize;
	return function;
}